

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_range_vector.hpp
# Opt level: O0

vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
* __thiscall
burst::make_range_vector_t::operator()
          (vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
           *__return_storage_ptr__,make_range_vector_t *this,
          vector<int,_std::allocator<int>_> *collections,
          vector<int,_std::allocator<int>_> *collections_1,
          vector<int,_std::allocator<int>_> *collections_2)

{
  initializer_list<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  values;
  iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_70;
  iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_60;
  iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
  local_50;
  iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  *local_40;
  undefined8 local_38;
  vector<int,_std::allocator<int>_> *local_30;
  vector<int,_std::allocator<int>_> *collections_local_2;
  vector<int,_std::allocator<int>_> *collections_local_1;
  vector<int,_std::allocator<int>_> *collections_local;
  make_range_vector_t *this_local;
  
  local_30 = collections_2;
  collections_local_2 = collections_1;
  collections_local_1 = collections;
  collections_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (make_range_vector_t *)__return_storage_ptr__;
  local_70 = (iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
              )boost::make_iterator_range<std::vector<int,std::allocator<int>>>(collections);
  local_60 = (iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
              )boost::make_iterator_range<std::vector<int,std::allocator<int>>>(collections_local_2)
  ;
  local_50.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
       = (iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
          )boost::make_iterator_range<std::vector<int,std::allocator<int>>>(local_30);
  local_40 = &local_70;
  local_38 = 3;
  values._M_len = (size_type)collections_1;
  values._M_array = (iterator)0x3;
  make_vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (__return_storage_ptr__,(burst *)local_40,values);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Collections & ... collections) const
        {
            return make_vector({boost::make_iterator_range(collections)...});
        }